

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O2

shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> __thiscall
CoreML::Recommender::constructAndValidateItemSimilarityRecommenderFromSpec
          (Recommender *this,Model *spec)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_00;
  bool bVar1;
  ItemSimilarityRecommender *from;
  invalid_argument *piVar2;
  string *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *pMVar4;
  long lVar5;
  shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> sVar6;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  allocator_type local_159;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types;
  Result result;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types_1;
  undefined1 local_e8 [8];
  long local_e0 [3];
  string local_c8 [32];
  ModelDescription *local_a8;
  ItemSimilarityRecommender isr;
  
  pMVar4 = spec->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateModelDescription(&result,pMVar4,spec->specificationversion_);
  bVar1 = Result::good(&result);
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar3 = Result::message_abi_cxx11_(&result);
    std::invalid_argument::invalid_argument(piVar2,(string *)psVar3);
LAB_0023da55:
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (spec->_oneof_case_[0] != 0x1f5) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar3 = Result::message_abi_cxx11_(&result);
    std::invalid_argument::invalid_argument(piVar2,(string *)psVar3);
    goto LAB_0023da55;
  }
  from = Specification::Model::itemsimilarityrecommender(spec);
  Specification::ItemSimilarityRecommender::ItemSimilarityRecommender(&isr,from);
  std::
  make_shared<CoreML::Recommender::_ItemSimilarityRecommenderData,CoreML::Specification::ItemSimilarityRecommender&>
            ((ItemSimilarityRecommender *)this);
  if (*(long *)(*(long *)this + 0xd0) == 0) {
    if ((pMVar4->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar2,"Name of column for item input data not specified.");
      goto LAB_0023db24;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar4->input_).super_RepeatedPtrFieldBase,0);
    std::__cxx11::string::_M_assign((string *)(*(long *)this + 200));
  }
  local_e8._0_4_ = INVALID_COMPATIBILITY_VERSION;
  local_e8._4_4_ = MODEL_MAIN_INPUT_COUNT_MISMATCHED;
  local_e0[0]._0_4_ = 5;
  __l._M_len = 3;
  __l._M_array = (iterator)local_e8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&allowed_item_input_types,__l,(allocator_type *)&allowed_item_input_types_1);
  this_00 = &pMVar4->input_;
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_e8,(CoreML *)this_00,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(*(long *)this + 200),
             (string *)&allowed_item_input_types,in_R8);
  Result::operator=(&result,(Result *)local_e8);
  std::__cxx11::string::~string((string *)local_e0);
  bVar1 = Result::good(&result);
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar3 = Result::message_abi_cxx11_(&result);
    std::invalid_argument::invalid_argument(piVar2,(string *)psVar3);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base(&allowed_item_input_types.
                   super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 );
  lVar5 = *(long *)this;
  if (*(long *)(lVar5 + 0x90) != 0) {
    allowed_item_input_types_1.
    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&allowed_item_input_types_1;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&allowed_item_input_types,__l_00,&local_159);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_e8,(CoreML *)this_00,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar5 + 0x88),
               (string *)&allowed_item_input_types,in_R8);
    Result::operator=(&result,(Result *)local_e8);
    std::__cxx11::string::~string((string *)local_e0);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&allowed_item_input_types.
                     super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   );
    bVar1 = Result::good(&result);
    if (!bVar1) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar3 = Result::message_abi_cxx11_(&result);
      std::invalid_argument::invalid_argument(piVar2,(string *)psVar3);
LAB_0023db24:
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  local_e8._0_4_ = UNSUPPORTED_COMPATIBILITY_VERSION;
  local_e8._4_4_ = MODEL_MAIN_IMAGE_OUTPUT_SIZE_BAD;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_e8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&allowed_item_input_types_1,__l_01,(allocator_type *)&allowed_item_input_types);
  std::__cxx11::string::string((string *)local_e8,(string *)(*(long *)this + 0xa8));
  local_a8 = pMVar4;
  std::__cxx11::string::string(local_c8,(string *)(*(long *)this + 0x68));
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x20) {
    if (*(long *)((long)local_e0 + lVar5) != 0) {
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&allowed_item_input_types,(CoreML *)this_00,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                 ((long)local_e0 + lVar5 + -8),(string *)&allowed_item_input_types_1,in_R8);
      Result::operator=(&result,(Result *)&allowed_item_input_types);
      std::__cxx11::string::~string
                ((string *)
                 &allowed_item_input_types.
                  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      bVar1 = Result::good(&result);
      if (!bVar1) {
        piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
        psVar3 = Result::message_abi_cxx11_(&result);
        std::invalid_argument::invalid_argument(piVar2,(string *)psVar3);
        __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
  }
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)local_e0 + lVar5 + -8));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base(&allowed_item_input_types_1.
                   super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 );
  pMVar4 = local_a8;
  lVar5 = *(long *)this;
  if (*(long *)(lVar5 + 0x110) == 0) {
    if (*(long *)(lVar5 + 0xf0) == 0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"No output columns specified.");
      goto LAB_0023db54;
    }
  }
  else {
    allowed_item_input_types_1.
    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 6;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&allowed_item_input_types_1;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&allowed_item_input_types,__l_02,&local_159);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_e8,(CoreML *)&pMVar4->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar5 + 0x108),
               (string *)&allowed_item_input_types,in_R8);
    Result::operator=(&result,(Result *)local_e8);
    std::__cxx11::string::~string((string *)local_e0);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&allowed_item_input_types.
                     super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   );
    bVar1 = Result::good(&result);
    if (!bVar1) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar3 = Result::message_abi_cxx11_(&result);
      std::invalid_argument::invalid_argument(piVar2,(string *)psVar3);
      goto LAB_0023db54;
    }
    lVar5 = *(long *)this;
    if (*(long *)(lVar5 + 0xf0) == 0) goto LAB_0023d9ac;
  }
  allowed_item_input_types_1.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&allowed_item_input_types_1;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&allowed_item_input_types,__l_03,&local_159);
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_e8,(CoreML *)&pMVar4->output_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar5 + 0xe8),
             (string *)&allowed_item_input_types,in_R8);
  Result::operator=(&result,(Result *)local_e8);
  std::__cxx11::string::~string((string *)local_e0);
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base(&allowed_item_input_types.
                   super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 );
  bVar1 = Result::good(&result);
  if (bVar1) {
LAB_0023d9ac:
    Specification::ItemSimilarityRecommender::~ItemSimilarityRecommender(&isr);
    std::__cxx11::string::~string((string *)&result.m_message);
    sVar6.
    super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    sVar6.
    super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData>)
           sVar6.
           super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  psVar3 = Result::message_abi_cxx11_(&result);
  std::invalid_argument::invalid_argument(piVar2,(string *)psVar3);
LAB_0023db54:
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<_ItemSimilarityRecommenderData>
  constructAndValidateItemSimilarityRecommenderFromSpec(const Specification::Model& spec){
    const auto& interface = spec.description();

      // Validate its a MLModel type.
    auto result = validateModelDescription(interface, spec.specificationversion());

    if(!result.good()) {
      throw std::invalid_argument(result.message());
    }

    /** Preliminary. -- get the right tree parameters out to get all the nodes.
     */
    if(!spec.has_itemsimilarityrecommender()) {
      throw std::invalid_argument(result.message());
    }

    auto isr = spec.itemsimilarityrecommender();

    auto ret = std::make_shared<_ItemSimilarityRecommenderData>(isr);

    // Perform validation on the constructed data set

    // Validate the input column
    {
      if(ret->item_data_input_column.empty()) {
        if(interface.input_size() == 1) {
          ret->item_data_input_column = interface.input(0).name();
        } else {
          throw std::invalid_argument("Name of column for item input data not specified.");
        }
      }

      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kDictionaryType,
        Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                 ret->item_data_input_column,
                                                                 allowed_item_input_types);
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
    }

    // Now validate the num recommendations input
    {

      if(!ret->num_recommendations_input_column.empty()) {
        result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                   ret->num_recommendations_input_column,
                                                                   {Specification::FeatureType::kInt64Type});
        if(!result.good()) {
          throw std::invalid_argument(result.message());
        }
      }
    }

    // Now test the more advanced item inclusion and exclusion columns.
    {
      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      for(const auto& n : {ret->item_exclusion_input_column, ret->item_restriction_input_column}) {
        if(!n.empty()) {
          result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                     n,
                                                                     allowed_item_input_types);

          if(!result.good()) {
            throw std::invalid_argument(result.message());
          }
        }
      }
    }

    // Now validate the num recommendations output
    bool output_column_specified = false;
    if(!ret->item_score_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_score_output_column,
                                                                 {Specification::FeatureType::kDictionaryType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    // Now validate the num recommendations output
    if(!ret->item_list_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_list_output_column,
                                                                 {Specification::FeatureType::kSequenceType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    if(!output_column_specified) {
      throw std::invalid_argument("No output columns specified.");
    }

    return ret;
  }